

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangular.cpp
# Opt level: O0

double __thiscall Rectangular::coordinateZ(Rectangular *this,int J,int K,int L,int G)

{
  double dVar1;
  double local_30;
  int G_local;
  int L_local;
  int K_local;
  int J_local;
  Rectangular *this_local;
  
  (this->super_Parameterization).x =
       (double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_lb;
  dVar1 = sqrt((this->super_Parameterization).radius * (this->super_Parameterization).radius +
               -((this->super_Parameterization).x * (this->super_Parameterization).x));
  (this->super_Parameterization).y_lb = -dVar1;
  dVar1 = sqrt((this->super_Parameterization).radius * (this->super_Parameterization).radius +
               -((this->super_Parameterization).x * (this->super_Parameterization).x));
  (this->super_Parameterization).y_ub = dVar1;
  (this->super_Parameterization).dy =
       ((this->super_Parameterization).y_ub - (this->super_Parameterization).y_lb) /
       (double)((this->super_Parameterization).Kmax + -1);
  (this->super_Parameterization).y =
       (double)K * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
  if (-(this->super_Parameterization).y * (this->super_Parameterization).y +
      (this->super_Parameterization).radius * (this->super_Parameterization).radius +
      -((this->super_Parameterization).x * (this->super_Parameterization).x) <= 0.0) {
    local_30 = 0.0;
  }
  else {
    local_30 = -(this->super_Parameterization).y * (this->super_Parameterization).y +
               (this->super_Parameterization).radius * (this->super_Parameterization).radius +
               -((this->super_Parameterization).x * (this->super_Parameterization).x);
  }
  dVar1 = sqrt(local_30);
  (this->super_Parameterization).z_lb = -dVar1;
  (this->super_Parameterization).z_ub = -(this->super_Parameterization).z_lb;
  if (G == 0) {
    (this->super_Parameterization).z = (this->super_Parameterization).z_lb;
  }
  else if (G == 1) {
    (this->super_Parameterization).z = (this->super_Parameterization).z_ub;
  }
  return (this->super_Parameterization).z;
}

Assistant:

double Rectangular::coordinateZ(int J, int K, int L, int G) {
  x = x_lb + (double)J * dx;

  y_lb = -sqrt(radius * radius - x * x);
  y_ub =  sqrt(radius * radius - x * x);

  dy = (y_ub - y_lb) / (double)(Kmax - 1);

  y = y_lb + (double)K * dy;

  z_lb = -sqrt(max(0.0e0, radius * radius - x * x - y * y));
  z_ub = -z_lb;

  switch (G) {
    case 0:  // Lower z
      z = z_lb;
      break;
    case 1:  // Upper z
      z = z_ub;
      break;
  }

  return z;
}